

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O3

void __thiscall
CMU462::DynamicScene::XFormWidget::drag
          (XFormWidget *this,double x,double y,double dx,double dy,Matrix4x4 *modelViewProj)

{
  Axis AVar1;
  Mode MVar2;
  SceneObject *pSVar3;
  HalfedgeElement *pHVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  undefined4 *puVar10;
  Vector3D *unaff_R13;
  bool bVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  double dVar14;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  vector<int,_std::allocator<int>_> I;
  int view [4];
  double winZ;
  double winX;
  double proj [16];
  vector<int,_std::allocator<int>_> local_268;
  vector<int,_std::allocator<int>_> local_250;
  Matrix4x4 local_238;
  vector<int,_std::allocator<int>_> local_1b8;
  vector<int,_std::allocator<int>_> local_1a0;
  undefined8 local_188;
  undefined8 uStack_180;
  Vector3D local_178;
  Vector3D local_158;
  double local_138;
  int iStack_12c;
  double local_128;
  double dStack_120;
  undefined1 local_110 [8];
  double local_108;
  double local_100;
  Vector3D local_f8;
  Vector3D local_d8;
  Vector4D local_b8 [4];
  
  AVar1 = (this->target).axis;
  pSVar3 = (this->target).object;
  if (pSVar3 == (SceneObject *)0x0 || AVar1 == None) {
    return;
  }
  pHVar4 = (this->target).element;
  if ((pHVar4 == (HalfedgeElement *)0x0) && ((this->objectMode & 1U) == 0)) {
    return;
  }
  MVar2 = this->mode;
  if ((this->objectMode & 1U) == 0) {
    if (AVar1 == Center && MVar2 == Translate) {
      (*pHVar4->_vptr_HalfedgeElement[4])(pHVar4,modelViewProj);
      return;
    }
    lVar6 = __dynamic_cast(pHVar4,&HalfedgeElement::typeinfo,&Vertex::typeinfo,0);
    lVar7 = __dynamic_cast(pHVar4,&HalfedgeElement::typeinfo,&Edge::typeinfo,0);
    lVar8 = __dynamic_cast(pHVar4,&HalfedgeElement::typeinfo,&Face::typeinfo,0);
    (**pHVar4->_vptr_HalfedgeElement)(&local_238,pHVar4);
    (this->center).z = local_238.entries[0].z;
    (this->center).x = local_238.entries[0].x;
    (this->center).y = local_238.entries[0].y;
    local_b8[0].x = 0.0;
    local_b8[0].y = (double)((ulong)local_b8[0].y._4_4_ << 0x20);
    __l._M_len = 3;
    __l._M_array = (iterator)local_b8;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_238,__l,(allocator_type *)&local_138);
    puVar10 = (undefined4 *)local_238.entries[0].x;
    switch((this->target).axis) {
    case X:
      break;
    case Y:
      puVar10 = (undefined4 *)((long)local_238.entries[0].x + 4);
      break;
    case Z:
      puVar10 = (undefined4 *)((long)local_238.entries[0].x + 8);
      break;
    case Center:
      *(undefined8 *)((long)local_238.entries[0].x + 4) = 0x100000001;
      break;
    default:
      goto switchD_0017527f_default;
    }
    *puVar10 = 1;
switchD_0017527f_default:
    if (lVar6 == 0) {
      if (lVar7 == 0) {
        if (lVar8 != 0) {
          lVar6 = *(long *)(lVar8 + 0xa8);
          do {
            lVar7 = *(long *)(lVar6 + 0x28);
            std::vector<int,_std::allocator<int>_>::vector
                      (&local_1b8,(vector<int,_std::allocator<int>_> *)&local_238);
            local_178.x = (this->center).x;
            local_178.y = (this->center).y;
            local_178.z = (this->center).z;
            directionalTransform
                      (this,(Vector3D *)(lVar7 + 0x18),&local_1b8,&local_178,x,y,dx,dy,modelViewProj
                      );
            if (local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            lVar6 = *(long *)(lVar6 + 0x20);
          } while (*(long *)(lVar8 + 0xa8) != lVar6);
        }
      }
      else {
        lVar6 = *(long *)(lVar7 + 0x58);
        do {
          lVar8 = *(long *)(lVar6 + 0x28);
          std::vector<int,_std::allocator<int>_>::vector
                    (&local_1a0,(vector<int,_std::allocator<int>_> *)&local_238);
          local_158.x = (this->center).x;
          local_158.y = (this->center).y;
          local_158.z = (this->center).z;
          directionalTransform
                    (this,(Vector3D *)(lVar8 + 0x18),&local_1a0,&local_158,x,y,dx,dy,modelViewProj);
          if (local_1a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_1a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          lVar6 = *(long *)(lVar6 + 0x18);
        } while (*(long *)(lVar7 + 0x58) != lVar6);
      }
    }
    else {
      std::vector<int,_std::allocator<int>_>::vector
                (&local_268,(vector<int,_std::allocator<int>_> *)&local_238);
      local_f8.x = (this->center).x;
      local_f8.y = (this->center).y;
      local_f8.z = (this->center).z;
      directionalTransform
                (this,(Vector3D *)(lVar6 + 8),&local_268,&local_f8,x,y,dx,dy,modelViewProj);
      if (local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    (this->clickPosition).x = x;
    (this->clickPosition).y = y;
    goto LAB_001756d2;
  }
  if (MVar2 == Scale) {
    unaff_R13 = &pSVar3->scale;
  }
  else {
    if (MVar2 == Rotate) {
      glGetDoublev(0xba6,&local_238);
      glGetDoublev(0xba7,local_b8);
      glGetIntegerv(0xba2,&local_138);
      gluProject((this->center).x,SUB84((this->center).y,0),(this->center).z,&local_238,local_b8,
                 &local_138,&local_100,&local_108,local_110);
      dVar14 = atan2(((double)iStack_12c - local_108) - y,x - local_100);
      uVar9 = (ulong)(this->target).axis;
      if (2 < uVar9) {
        return;
      }
      (&(pSVar3->rotation).x)[uVar9] = (dVar14 / 3.141592653589793) * 180.0;
      return;
    }
    if ((MVar2 == Translate) && (unaff_R13 = &pSVar3->position, AVar1 == Center)) {
      local_b8[0].x = (pSVar3->position).x;
      local_b8[0].y = (pSVar3->position).y;
      local_b8[0].z = (pSVar3->position).z;
      local_b8[0].w = 1.0;
      Matrix4x4::operator*(modelViewProj,local_b8);
      dVar14 = 1.0 / local_238.entries[0].w;
      local_b8[0].x = (dVar14 * local_238.entries[0].x + dx) * local_238.entries[0].w;
      local_b8[0].y = (dVar14 * local_238.entries[0].y + dy) * local_238.entries[0].w;
      local_b8[0].z = local_238.entries[0].z * dVar14 * local_238.entries[0].w;
      local_b8[0].w = local_238.entries[0].w * dVar14 * local_238.entries[0].w;
      Matrix4x4::inv(&local_238,modelViewProj);
      Matrix4x4::operator*(&local_238,local_b8);
      local_b8[0].z = local_128;
      local_b8[0].w = dStack_120;
      local_b8[0].x = local_138;
      Vector4D::to3D(local_b8);
      (pSVar3->position).z = local_238.entries[0].z;
      unaff_R13->x = local_238.entries[0].x;
      (pSVar3->position).y = local_238.entries[0].y;
      return;
    }
  }
  local_b8[0].x = 0.0;
  local_b8[0].y = (double)((ulong)local_b8[0].y & 0xffffffff00000000);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_b8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_238,__l_00,(allocator_type *)&local_138);
  puVar10 = (undefined4 *)local_238.entries[0].x;
  switch((this->target).axis) {
  case X:
    break;
  case Y:
    puVar10 = (undefined4 *)((long)local_238.entries[0].x + 4);
    break;
  case Z:
    puVar10 = (undefined4 *)((long)local_238.entries[0].x + 8);
    break;
  case Center:
    *(undefined8 *)((long)local_238.entries[0].x + 4) = 0x100000001;
    break;
  default:
    goto switchD_001753aa_default;
  }
  *puVar10 = 1;
switchD_001753aa_default:
  MVar2 = this->mode;
  local_188 = (this->center).x;
  uStack_180 = (this->center).y;
  dVar14 = (this->center).z;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_250,(vector<int,_std::allocator<int>_> *)&local_238);
  bVar11 = MVar2 == Translate;
  uVar12 = SUB84(dVar14,0);
  uVar13 = (undefined4)((ulong)dVar14 >> 0x20);
  if (!bVar11) {
    uVar12 = 0;
    uVar13 = 0;
  }
  uVar5 = (uint)bVar11;
  local_d8.x._0_4_ = (int)(uVar5 << 0x1f) >> 0x1f & (uint)local_188;
  local_d8.x._4_4_ = (int)(uVar5 << 0x1f) >> 0x1f & local_188._4_4_;
  local_d8.y._0_4_ = (int)(uVar5 << 0x1f) >> 0x1f & (uint)uStack_180;
  local_d8.y._4_4_ = (int)(uVar5 << 0x1f) >> 0x1f & uStack_180._4_4_;
  local_d8.z = (double)CONCAT44(uVar13,uVar12);
  directionalTransform(this,unaff_R13,&local_250,&local_d8,x,y,dx,dy,modelViewProj);
  if (local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_001756d2:
  if ((undefined4 *)local_238.entries[0].x != (undefined4 *)0x0) {
    operator_delete((void *)local_238.entries[0].x,
                    (long)local_238.entries[0].z - (long)local_238.entries[0].x);
  }
  return;
}

Assistant:

void XFormWidget::drag( double x, double y, double dx, double dy, const Matrix4x4& modelViewProj )
{
  if (target.axis == Selection::Axis::None) return;
  if (target.object == nullptr) return;
  if (target.element == nullptr && !objectMode) return;

  if (objectMode) {
    Vector3D *update;
    switch (mode) {
      case Mode::Translate:
        update = &target.object->position;
        break;
      case Mode::Scale:
        update = &target.object->scale;
        break;
      case Mode::Rotate:
        update = &target.object->rotation;
        break;
    }

    if (mode == Mode::Rotate) {
      double winX, winY, winZ;
      double model[16], proj[16];
      int view[4];
      glGetDoublev(GL_MODELVIEW_MATRIX, model);
      glGetDoublev(GL_PROJECTION_MATRIX, proj);
      glGetIntegerv(GL_VIEWPORT, view);
      gluProject(center.x, center.y, center.z, model, proj, view, &winX, &winY, &winZ);
      winY = view[3] - winY;
      double theta = atan2(winY - y, x - winX) / PI * 180;
      switch (target.axis) {
        case Selection::Axis::X:
          update->x = theta;
          break;
        case Selection::Axis::Y:
          update->y = theta;
          break;
        case Selection::Axis::Z:
          update->z = theta;
          break;
        }
    }
    else if (mode == Mode::Translate &&
        target.axis == Selection::Axis::Center) {        
      Vector4D q( *update, 1. );
      q = modelViewProj * q; 
      double w = q.w;
      q /= w;
      // Shift by (dx, dy).
      q.x += dx;
      q.y += dy;
      // Transform back into model s*updateace
      q *= w;
      q = modelViewProj.inv() * q;
      *update = q.to3D();
    }
    else
    {
      vector<int> I = { 0, 0, 0 };
      switch (target.axis)
      {
      case Selection::Axis::X:
        I[0] = 1;
        break;
      case Selection::Axis::Y:
        I[1] = 1;
        break;
      case Selection::Axis::Z:
        I[2] = 1;
        break;
      case Selection::Axis::Center:
        I[0] = I[1] = I[2] = 1;
        break;
      default:
        break;
      }
      Vector3D c = mode == Mode::Translate ? center : Vector3D(0, 0, 0);
      directionalTransform(*update, I, c, x, y, dx, dy, modelViewProj);
    }

    return;
  }

   if( mode == Mode::Translate &&
       target.axis == Selection::Axis::Center )
   {
      target.element->translate( dx, dy, modelViewProj );
      // TODO uniform scale, free rotate
      return;
   }

   Vertex* v = target.element->getVertex();
   Edge*   e = target.element->getEdge();
   Face*   f = target.element->getFace();

   center = target.element->centroid();

   vector<int> I = { 0, 0, 0 };
   switch( target.axis )
   {
      case Selection::Axis::X:
         I[0] = 1;
         break;
      case Selection::Axis::Y:
         I[1] = 1;
         break;
      case Selection::Axis::Z:
         I[2] = 1;
         break;
      case Selection::Axis::Center:
         I[0] = I[1] = I[2] = 1;
         break;
      default:
         break;
   }

   if( v )
   {
      directionalTransform( v->position, I, center, x, y, dx, dy, modelViewProj );
   }
   else if( e )
   {
      HalfedgeIter h = e->halfedge();
      do
      {
         directionalTransform( h->vertex()->position, I, center, x, y, dx, dy, modelViewProj );
         h = h->twin();
      }
      while( h != e->halfedge() );
   }
   else if( f )
   {
      HalfedgeIter h = f->halfedge();
      do
      {
         directionalTransform( h->vertex()->position, I, center, x, y, dx, dy, modelViewProj );
         h = h->next();
      }
      while( h != f->halfedge() );
   }

   clickPosition = Vector2D(x,y);
}